

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIScrollBar::draw(CGUIScrollBar *this)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  u32 uVar4;
  long *plVar5;
  int iVar6;
  undefined1 local_24 [4];
  
  if ((this->field_0xa0 == '\x01') &&
     (plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))(), plVar5 != (long *)0x0)
     ) {
    bVar3 = (**(code **)(*(long *)this + 0x90))(this);
    uVar4 = (**(code **)*plVar5)(plVar5,(uint)(bVar3 ^ 1) + (uint)(bVar3 ^ 1) * 2 + 0x12);
    if ((this->CurrentIconColor).color != uVar4) {
      refreshControls(this);
    }
    iVar1 = *(int *)&this->field_0x44;
    iVar6 = *(int *)&this->field_0x48;
    iVar2 = *(int *)&this->field_0x4c;
    (this->SliderRect).UpperLeftCorner.X = *(int *)&this->field_0x40;
    (this->SliderRect).UpperLeftCorner.Y = iVar1;
    (this->SliderRect).LowerRightCorner.X = iVar6;
    (this->SliderRect).LowerRightCorner.Y = iVar2;
    (**(code **)*plVar5)(plVar5,0x10);
    (**(code **)(*plVar5 + 0xa8))(plVar5,this,local_24,&this->SliderRect,&this->field_0x50);
    if (1e-06 < ABS((float)(this->Max - this->Min))) {
      if (this->Horizontal == true) {
        iVar1 = this->DrawHeight;
        iVar6 = ((this->DrawPos + *(int *)&this->field_0x40 + *(int *)&this->field_0x3c) -
                *(int *)&this->field_0x34) + iVar1 / -2;
        (this->SliderRect).UpperLeftCorner.X = iVar6;
        (this->SliderRect).LowerRightCorner.X = iVar6 + iVar1;
      }
      else {
        iVar1 = this->DrawHeight;
        iVar6 = ((this->DrawPos + *(int *)&this->field_0x44 + *(int *)&this->field_0x38) -
                *(int *)&this->field_0x30) + iVar1 / -2;
        (this->SliderRect).UpperLeftCorner.Y = iVar6;
        (this->SliderRect).LowerRightCorner.Y = iVar6 + iVar1;
      }
      (**(code **)(*plVar5 + 0x60))(plVar5,this,&this->SliderRect,&this->field_0x50);
    }
    IGUIElement::draw((IGUIElement *)this);
  }
  return;
}

Assistant:

void CGUIScrollBar::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return;

	video::SColor iconColor = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);
	if (iconColor != CurrentIconColor) {
		refreshControls();
	}

	SliderRect = AbsoluteRect;

	// draws the background
	skin->draw2DRectangle(this, skin->getColor(EGDC_SCROLLBAR), SliderRect, &AbsoluteClippingRect);

	if (core::isnotzero(range())) {
		// recalculate slider rectangle
		if (Horizontal) {
			SliderRect.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X + DrawPos + RelativeRect.getHeight() - DrawHeight / 2;
			SliderRect.LowerRightCorner.X = SliderRect.UpperLeftCorner.X + DrawHeight;
		} else {
			SliderRect.UpperLeftCorner.Y = AbsoluteRect.UpperLeftCorner.Y + DrawPos + RelativeRect.getWidth() - DrawHeight / 2;
			SliderRect.LowerRightCorner.Y = SliderRect.UpperLeftCorner.Y + DrawHeight;
		}

		skin->draw3DButtonPaneStandard(this, SliderRect, &AbsoluteClippingRect);
	}

	// draw buttons
	IGUIElement::draw();
}